

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmbstr.c
# Opt level: O1

uint prvTidytmbstrncpy(tmbstr s1,ctmbstr s2,uint size)

{
  char cVar1;
  char *pcVar2;
  
  if (s2 != (ctmbstr)0x0 && s1 != (tmbstr)0x0) {
    cVar1 = *s2;
    if (cVar1 != '\0') {
      pcVar2 = s2 + 1;
      do {
        if (size == 1) {
          size = 0;
          break;
        }
        *s1 = cVar1;
        s1 = s1 + 1;
        cVar1 = *pcVar2;
        pcVar2 = pcVar2 + 1;
        size = size - 1;
      } while (cVar1 != '\0');
    }
    *s1 = '\0';
  }
  return size;
}

Assistant:

uint TY_(tmbstrncpy)( tmbstr s1, ctmbstr s2, uint size )
{
    if ( s1 != NULL && s2 != NULL )
    {
        tmbstr cp = s1;
        while ( *s2 && --size )  /* Predecrement: reserve byte */
            *cp++ = *s2++;       /* for NULL terminator. */
        *cp = 0;
    }
    return size;
}